

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int kinLsDenseDQJac(N_Vector u,N_Vector fu,SUNMatrix Jac,KINMem kin_mem,N_Vector tmp1,N_Vector tmp2)

{
  long *plVar1;
  double dVar2;
  void *pvVar3;
  int iVar4;
  sunindextype sVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  sunrealtype *psVar9;
  long j;
  double dVar10;
  double dVar11;
  
  pvVar3 = kin_mem->kin_lmem;
  sVar5 = SUNDenseMatrix_Columns(Jac);
  uVar6 = N_VGetArrayPointer(tmp2);
  lVar7 = N_VGetArrayPointer(u);
  lVar8 = N_VGetArrayPointer(kin_mem->kin_uscale);
  if (0 < sVar5) {
    j = 0;
    do {
      psVar9 = SUNDenseMatrix_Column(Jac,j);
      N_VSetArrayPointer(psVar9,tmp2);
      dVar2 = *(double *)(lVar7 + j * 8);
      dVar11 = 1.0 / *(double *)(lVar8 + j * 8);
      dVar10 = ABS(dVar2);
      if (ABS(dVar2) <= dVar11) {
        dVar10 = dVar11;
      }
      dVar10 = dVar10 * kin_mem->kin_sqrt_relfunc;
      dVar11 = (double)(~-(ulong)(0.0 <= dVar2) & (ulong)-dVar10 |
                       -(ulong)(0.0 <= dVar2) & (ulong)dVar10);
      *(double *)(lVar7 + j * 8) = dVar2 + dVar11;
      iVar4 = (*kin_mem->kin_func)(u,tmp1,kin_mem->kin_user_data);
      plVar1 = (long *)((long)pvVar3 + 0x40);
      *plVar1 = *plVar1 + 1;
      if (iVar4 != 0) goto LAB_00110e93;
      *(double *)(lVar7 + j * 8) = dVar2;
      dVar11 = 1.0 / dVar11;
      N_VLinearSum(SUB84(dVar11,0),-dVar11,tmp1,fu,tmp2);
      j = j + 1;
    } while (sVar5 != j);
  }
  iVar4 = 0;
LAB_00110e93:
  N_VSetArrayPointer(uVar6,tmp2);
  return iVar4;
}

Assistant:

int kinLsDenseDQJac(N_Vector u, N_Vector fu, SUNMatrix Jac, KINMem kin_mem,
                    N_Vector tmp1, N_Vector tmp2)
{
  sunrealtype inc, inc_inv, ujsaved, ujscale, sign;
  sunrealtype *tmp2_data, *u_data, *uscale_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  KINLsMem kinls_mem;
  int retval = 0;

  /* access LsMem interface structure */
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Save pointer to the array in tmp2 */
  tmp2_data = N_VGetArrayPointer(tmp2);

  /* Rename work vectors for readibility */
  ftemp  = tmp1;
  jthCol = tmp2;

  /* Obtain pointers to the data for u and uscale */
  u_data      = N_VGetArrayPointer(u);
  uscale_data = N_VGetArrayPointer(kin_mem->kin_uscale);

  /* This is the only for loop for 0..N-1 in KINSOL */

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(u) */

    /* Set data address of jthCol, and save u_j values and scaling */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);
    ujsaved = u_data[j];
    ujscale = ONE / uscale_data[j];

    /* Compute increment */
    sign = (ujsaved >= ZERO) ? ONE : -ONE;
    inc  = kin_mem->kin_sqrt_relfunc * SUNMAX(SUNRabs(ujsaved), ujscale) * sign;

    /* Increment u_j, call F(u), and return if error occurs */
    u_data[j] += inc;

    retval = kin_mem->kin_func(u, ftemp, kin_mem->kin_user_data);
    kinls_mem->nfeDQ++;
    if (retval != 0) { break; }

    /* reset u_j */
    u_data[j] = ujsaved;

    /* Construct difference quotient in jthCol */
    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fu, jthCol);
  }

  /* Restore original array pointer in tmp2 */
  N_VSetArrayPointer(tmp2_data, tmp2);

  return (retval);
}